

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

Vec_Int_t * Ga2_ManCnfCompute(uint uTruth,int nVars,Vec_Int_t *vCover)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *__dest;
  size_t __size;
  uint uTruth_local;
  
  uTruth_local = uTruth;
  if (5 < nVars) {
    __assert_fail("nVars <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x279,"Vec_Int_t *Ga2_ManCnfCompute(unsigned int, int, Vec_Int_t *)");
  }
  iVar1 = Kit_TruthIsop(&uTruth_local,nVars,vCover,0);
  if (iVar1 == 0) {
    pVVar2 = (Vec_Int_t *)malloc(0x10);
    iVar1 = vCover->nSize;
    pVVar2->nSize = iVar1;
    pVVar2->nCap = iVar1;
    if ((long)iVar1 == 0) {
      __size = 0;
      __dest = (int *)0x0;
    }
    else {
      __size = (long)iVar1 << 2;
      __dest = (int *)malloc(__size);
    }
    pVVar2->pArray = __dest;
    memcpy(__dest,vCover->pArray,__size);
    return pVVar2;
  }
  __assert_fail("RetValue == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                ,0x27c,"Vec_Int_t *Ga2_ManCnfCompute(unsigned int, int, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Ga2_ManCnfCompute( unsigned uTruth, int nVars, Vec_Int_t * vCover )
{
    int RetValue;
    assert( nVars <= 5 );
    // transform truth table into the SOP
    RetValue = Kit_TruthIsop( &uTruth, nVars, vCover, 0 );
    assert( RetValue == 0 );
    // check the case of constant cover
    return Vec_IntDup( vCover );
}